

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariablesHelper.cxx
# Opt level: O0

shared_ptr<cmDebugger::cmDebuggerVariables> __thiscall
cmDebugger::cmDebuggerVariablesHelper::CreateIfAny
          (cmDebuggerVariablesHelper *this,
          shared_ptr<cmDebugger::cmDebuggerVariablesManager> *variablesManager,string *name,
          bool supportsVariableType,vector<cmFileSet_*,_std::allocator<cmFileSet_*>_> *fileSets)

{
  bool bVar1;
  element_type *this_00;
  string *name_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<cmDebugger::cmDebuggerVariables> sVar3;
  shared_ptr<cmDebugger::cmDebuggerVariables> local_68;
  reference local_58;
  cmFileSet **fileSet;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmFileSet_*,_std::allocator<cmFileSet_*>_> *__range1;
  vector<cmFileSet_*,_std::allocator<cmFileSet_*>_> *fileSets_local;
  bool supportsVariableType_local;
  string *name_local;
  shared_ptr<cmDebugger::cmDebuggerVariablesManager> *variablesManager_local;
  shared_ptr<cmDebugger::cmDebuggerVariables> *fileSetsVariables;
  
  bVar1 = std::vector<cmFileSet_*,_std::allocator<cmFileSet_*>_>::empty(fileSets);
  if (bVar1) {
    std::shared_ptr<cmDebugger::cmDebuggerVariables>::shared_ptr
              ((shared_ptr<cmDebugger::cmDebuggerVariables> *)this);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::
    make_shared<cmDebugger::cmDebuggerVariables,std::shared_ptr<cmDebugger::cmDebuggerVariablesManager>const&,std::__cxx11::string_const&,bool&>
              ((shared_ptr<cmDebugger::cmDebuggerVariablesManager> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)variablesManager
               ,(bool *)name);
    __end1 = std::vector<cmFileSet_*,_std::allocator<cmFileSet_*>_>::begin(fileSets);
    fileSet = (cmFileSet **)std::vector<cmFileSet_*,_std::allocator<cmFileSet_*>_>::end(fileSets);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<cmFileSet_*const_*,_std::vector<cmFileSet_*,_std::allocator<cmFileSet_*>_>_>
                                       *)&fileSet), _Var2._M_pi = extraout_RDX_00, bVar1) {
      local_58 = __gnu_cxx::
                 __normal_iterator<cmFileSet_*const_*,_std::vector<cmFileSet_*,_std::allocator<cmFileSet_*>_>_>
                 ::operator*(&__end1);
      this_00 = std::
                __shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      name_00 = cmFileSet::GetName_abi_cxx11_(*local_58);
      CreateIfAny((cmDebuggerVariablesHelper *)&local_68,variablesManager,name_00,
                  supportsVariableType,*local_58);
      cmDebuggerVariables::AddSubVariables(this_00,&local_68);
      std::shared_ptr<cmDebugger::cmDebuggerVariables>::~shared_ptr(&local_68);
      __gnu_cxx::
      __normal_iterator<cmFileSet_*const_*,_std::vector<cmFileSet_*,_std::allocator<cmFileSet_*>_>_>
      ::operator++(&__end1);
    }
  }
  sVar3.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cmDebugger::cmDebuggerVariables>)
         sVar3.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<cmDebuggerVariables> cmDebuggerVariablesHelper::CreateIfAny(
  std::shared_ptr<cmDebuggerVariablesManager> const& variablesManager,
  std::string const& name, bool supportsVariableType,
  std::vector<cmFileSet*> const& fileSets)
{
  if (fileSets.empty()) {
    return {};
  }

  auto fileSetsVariables = std::make_shared<cmDebuggerVariables>(
    variablesManager, name, supportsVariableType);

  for (auto const& fileSet : fileSets) {
    fileSetsVariables->AddSubVariables(CreateIfAny(
      variablesManager, fileSet->GetName(), supportsVariableType, fileSet));
  }

  return fileSetsVariables;
}